

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

TestStatus *
vkt::wsi::anon_unknown_0::resizeSwapchainTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  Vector<unsigned_int,_2> *this;
  undefined1 *this_00;
  VkAllocationCallbacks **vk;
  pointer *this_01;
  VkInstance pVVar1;
  VkDevice device_00;
  VkSurfaceKHR surface_00;
  RefData<vk::Handle<(vk::HandleType)25>_> data;
  RefData<vk::Handle<(vk::HandleType)24>_> data_00;
  VkFormat framebufferFormat;
  undefined1 auVar2 [8];
  GetPastPresentationTimingGOOGLEFunc p_Var3;
  VkResult VVar4;
  deBool dVar5;
  VkInstance_s **ppVVar6;
  Display *nativeDisplay;
  Window *nativeWindow;
  Handle<(vk::HandleType)25> *pHVar7;
  VkDevice_s **ppVVar8;
  ulong uVar9;
  size_type sVar10;
  reference desiredSize_00;
  Handle<(vk::HandleType)26> *pHVar11;
  ProgramCollection<vk::ProgramBinary> *binaryRegistry;
  Handle<(vk::HandleType)24> *pHVar12;
  ulong uVar13;
  const_reference this_02;
  RefBase<vk::Handle<(vk::HandleType)6>_> *this_03;
  Handle<(vk::HandleType)6> *pHVar14;
  const_reference pvVar15;
  RefBase<vk::Handle<(vk::HandleType)4>_> *pRVar16;
  Handle<(vk::HandleType)4> *pHVar17;
  void *pvVar18;
  TestContext *this_04;
  TestLog *this_05;
  MessageBuilder *pMVar19;
  TestError *this_06;
  const_reference this_07;
  RefBase<vk::VkCommandBuffer_s_*> *this_08;
  VkCommandBuffer_s **ppVVar20;
  VkCommandPool commandPool_00;
  undefined8 extraout_RDX;
  undefined8 uVar21;
  undefined8 extraout_RDX_00;
  VkSystemAllocationScope VVar22;
  Handle<(vk::HandleType)6> HVar23;
  allocator<char> local_1139;
  string local_1138;
  Handle<(vk::HandleType)6> local_1118;
  undefined4 local_1110 [2];
  VkPresentInfoKHR presentInfo;
  VkSubmitInfo submitInfo;
  VkCommandBuffer_s *pVStack_1080;
  VkPipelineStageFlags waitDstStage;
  VkCommandBuffer commandBuffer;
  VkSemaphore renderingCompleteSemaphore;
  VkResult local_ed8;
  undefined1 local_ed4 [4];
  VkResult acquireResult;
  deUint32 imageNdx;
  VkSemaphore imageReadySemaphore;
  VkFence imageReadyFence;
  deUint32 frameNdx;
  deUint32 numFramesToRender;
  undefined1 local_eb0 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  commandBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  renderingCompleteSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  imageReadySemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  imageReadyFences;
  size_t maxQueuedFrames;
  RefData<vk::Handle<(vk::HandleType)24>_> local_e28;
  undefined1 local_e08 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> commandPool;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> local_de0;
  undefined1 local_dc8 [8];
  TriangleRenderer renderer;
  undefined1 local_cd8 [8];
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  swapchainImages;
  Move<vk::Handle<(vk::HandleType)26>_> swapchain;
  undefined1 local_c98 [8];
  VkSwapchainCreateInfoKHR swapchainInfo;
  undefined1 local_c28 [4];
  deUint32 sizeNdx;
  Move<vk::Handle<(vk::HandleType)26>_> prevSwapchain;
  vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_> sizes;
  undefined1 local_9e8 [8];
  SimpleAllocator allocator;
  VkDevice device;
  DeviceInterface *vkd;
  undefined1 local_7ac [8];
  VkSurfaceCapabilitiesKHR capabilities;
  PlatformProperties *platformProperties;
  undefined1 local_768 [8];
  DeviceHelper devHelper;
  RefData<vk::Handle<(vk::HandleType)25>_> local_260;
  undefined1 local_240 [8];
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  Maybe<tcu::Vector<unsigned_int,_2>_> local_210;
  undefined1 local_200 [8];
  NativeObjects native;
  InstanceHelper instHelper;
  UVec2 desiredSize;
  Type wsiType_local;
  Context *context_local;
  
  this = (Vector<unsigned_int,_2> *)
         ((long)&instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX + 4);
  tcu::Vector<unsigned_int,_2>::Vector(this,0x100,0x100);
  this_00 = &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
             m_data.field_0x8;
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)this_00,context,wsiType,(VkAllocationCallbacks *)0x0);
  tcu::just<tcu::Vector<unsigned_int,2>>((tcu *)&local_210,this);
  NativeObjects::NativeObjects
            ((NativeObjects *)local_200,context,(Extensions *)this_00,wsiType,&local_210);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::~Maybe(&local_210);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar1 = *ppVVar6;
  nativeDisplay =
       de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::operator*
                 ((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_200);
  nativeWindow = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
                 operator*((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)
                           &native.display.
                            super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>
                            .m_data.field_0x8);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper.queue,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             pVVar1,wsiType,nativeDisplay,nativeWindow,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_260,(Move *)&devHelper.queue);
  data.deleter.m_instanceIface = local_260.deleter.m_instanceIface;
  data.object.m_internal = local_260.object.m_internal;
  data.deleter.m_instance = local_260.deleter.m_instance;
  data.deleter.m_allocator = local_260.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_240,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)25>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper.queue);
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar1 = *ppVVar6;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_240);
  DeviceHelper::DeviceHelper
            ((DeviceHelper *)local_768,context,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             pVVar1,(VkSurfaceKHR)pHVar7->m_internal,(VkAllocationCallbacks *)0x0);
  capabilities._44_8_ = ::vk::wsi::getPlatformProperties(wsiType);
  auVar2 = local_768;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_240);
  ::vk::wsi::getPhysicalDeviceSurfaceCapabilities
            ((VkSurfaceCapabilitiesKHR *)local_7ac,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             (VkPhysicalDevice)auVar2,(VkSurfaceKHR)pHVar7->m_internal);
  vk = &devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      ((RefBase<vk::VkDevice_s_*> *)&devHelper.queueFamilyIndex);
  device_00 = *ppVVar8;
  allocator.m_memProps.memoryHeaps[0xf]._8_8_ = device_00;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)
             &sizes.
              super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             (VkPhysicalDevice)local_768);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_9e8,(DeviceInterface *)vk,device_00,
             (VkPhysicalDeviceMemoryProperties *)
             &sizes.
              super__Vector_base<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  getSwapchainSizeSequence
            ((vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_> *
             )&prevSwapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.
               m_allocator,(VkSurfaceCapabilitiesKHR *)local_7ac,
             (UVec2 *)((long)&instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX +
                      4));
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)26>_>::Move
            ((Move<vk::Handle<(vk::HandleType)26>_> *)local_c28);
  swapchainInfo.oldSwapchain.m_internal._4_4_ = 0;
  do {
    uVar9 = (ulong)swapchainInfo.oldSwapchain.m_internal._4_4_;
    sVar10 = std::
             vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>::
             size((vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
                   *)&prevSwapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.
                      m_allocator);
    auVar2 = local_768;
    if (sVar10 <= uVar9) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1138,"Resizing tests succeeded",&local_1139);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_1138);
      std::__cxx11::string::~string((string *)&local_1138);
      std::allocator<char>::~allocator(&local_1139);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)26>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)26>_> *)local_c28);
      std::vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>::
      ~vector((vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
               *)&prevSwapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.
                  m_allocator);
      ::vk::SimpleAllocator::~SimpleAllocator((SimpleAllocator *)local_9e8);
      DeviceHelper::~DeviceHelper((DeviceHelper *)local_768);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_240);
      NativeObjects::~NativeObjects((NativeObjects *)local_200);
      InstanceHelper::~InstanceHelper
                ((InstanceHelper *)
                 &native.window.
                  super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.
                  field_0x8);
      return __return_storage_ptr__;
    }
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_240);
    surface_00.m_internal = pHVar7->m_internal;
    desiredSize_00 =
         std::vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>::
         operator[]((vector<tcu::Vector<unsigned_int,_2>,_std::allocator<tcu::Vector<unsigned_int,_2>_>_>
                     *)&prevSwapchain.super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.
                        m_allocator,(ulong)swapchainInfo.oldSwapchain.m_internal._4_4_);
    getBasicSwapchainParameters
              ((VkSwapchainCreateInfoKHR *)local_c98,wsiType,
               (InstanceInterface *)
               &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
               (VkPhysicalDevice)auVar2,surface_00,desiredSize_00,2);
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)26>_> *)local_c28);
    swapchainInfo._88_8_ = pHVar11->m_internal;
    ::vk::createSwapchainKHR
              ((Move<vk::Handle<(vk::HandleType)26>_> *)
               &swapchainImages.
                super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk,
               (VkDevice)allocator.m_memProps.memoryHeaps[0xf]._8_8_,
               (VkSwapchainCreateInfoKHR *)local_c98,(VkAllocationCallbacks *)0x0);
    uVar21 = allocator.m_memProps.memoryHeaps[0xf]._8_8_;
    pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)26>_> *)
                         &swapchainImages.
                          super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    renderer.m_framebuffers.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pHVar11->m_internal;
    ::vk::wsi::getSwapchainImages
              ((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                *)local_cd8,(DeviceInterface *)vk,(VkDevice)uVar21,
               (VkSwapchainKHR)
               renderer.m_framebuffers.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar21 = allocator.m_memProps.memoryHeaps[0xf]._8_8_;
    binaryRegistry = Context::getBinaryCollection(context);
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    vector(&local_de0,
           (vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *
           )local_cd8);
    framebufferFormat = swapchainInfo.surface.m_internal._4_4_;
    tcu::Vector<unsigned_int,_2>::Vector
              ((Vector<unsigned_int,_2> *)
               &commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                m_allocator,swapchainInfo.imageFormat,swapchainInfo.imageColorSpace);
    TriangleRenderer::TriangleRenderer
              ((TriangleRenderer *)local_dc8,(DeviceInterface *)vk,(VkDevice)uVar21,
               (Allocator *)local_9e8,binaryRegistry,&local_de0,framebufferFormat,
               (UVec2 *)&commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                         m_allocator);
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    ~vector(&local_de0);
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&maxQueuedFrames,(DeviceInterface *)vk,
               (VkDevice)allocator.m_memProps.memoryHeaps[0xf]._8_8_,2,
               (deUint32)devHelper.physicalDevice,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_e28,(Move *)&maxQueuedFrames);
    data_00.deleter.m_deviceIface = local_e28.deleter.m_deviceIface;
    data_00.object.m_internal = local_e28.object.m_internal;
    data_00.deleter.m_device = local_e28.deleter.m_device;
    data_00.deleter.m_allocator = local_e28.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_e08,data_00);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&maxQueuedFrames);
    sVar10 = std::
             vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
             ::size((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                     *)local_cd8);
    uVar9 = sVar10 * 2;
    createFences((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                  *)&imageReadySemaphores.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk,
                 (VkDevice)allocator.m_memProps.memoryHeaps[0xf]._8_8_,uVar9);
    createSemaphores((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                      *)&renderingCompleteSemaphores.
                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk,
                     (VkDevice)allocator.m_memProps.memoryHeaps[0xf]._8_8_,uVar9 + 1);
    createSemaphores((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                      *)&commandBuffers.
                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)vk,
                     (VkDevice)allocator.m_memProps.memoryHeaps[0xf]._8_8_,uVar9);
    uVar21 = allocator.m_memProps.memoryHeaps[0xf]._8_8_;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_e08);
    commandPool_00.m_internal = pHVar12->m_internal;
    HVar23.m_internal = 0;
    allocateCommandBuffers
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                *)local_eb0,(DeviceInterface *)vk,(VkDevice)uVar21,commandPool_00,
               VK_COMMAND_BUFFER_LEVEL_PRIMARY,uVar9);
    imageReadyFence.m_internal._4_4_ = 0x3c;
    uVar21 = extraout_RDX;
    for (imageReadyFence.m_internal._0_4_ = 0; VVar22 = (VkSystemAllocationScope)HVar23.m_internal,
        (uint)imageReadyFence.m_internal < 0x3c;
        imageReadyFence.m_internal._0_4_ = (uint)imageReadyFence.m_internal + 1) {
      uVar13 = (ulong)(uint)imageReadyFence.m_internal;
      sVar10 = std::
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
               ::size((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                       *)&imageReadySemaphores.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_02 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                              *)&imageReadySemaphores.
                                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar13 % sVar10)
      ;
      this_03 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::operator*
                           (this_02)->super_RefBase<vk::Handle<(vk::HandleType)6>_>;
      pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*(this_03);
      imageReadySemaphore.m_internal = pHVar14->m_internal;
      uVar13 = (ulong)(uint)imageReadyFence.m_internal;
      sVar10 = std::
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
               ::size((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                       *)&renderingCompleteSemaphores.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar15 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                              *)&renderingCompleteSemaphores.
                                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar13 % sVar10)
      ;
      pRVar16 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::operator*
                           (pvVar15)->super_RefBase<vk::Handle<(vk::HandleType)4>_>;
      pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::operator*(pRVar16);
      uVar21 = allocator.m_memProps.memoryHeaps[0xf]._8_8_;
      _acquireResult = pHVar17->m_internal;
      local_ed4 = (undefined1  [4])0xffffffff;
      if (uVar9 <= (uint)imageReadyFence.m_internal) {
        std::numeric_limits<unsigned_long>::max();
        VVar22 = VK_SYSTEM_ALLOCATION_SCOPE_OBJECT;
        VVar4 = (*devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator[3].
                  pfnInternalAllocation)
                          (vk,uVar21,VK_INTERNAL_ALLOCATION_TYPE_LAST,
                           (VkSystemAllocationScope)&imageReadySemaphore);
        ::vk::checkResult(VVar4,
                          "vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                          ,0x5f8);
      }
      pvVar18 = (*devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator[3].
                  pfnReallocation)(vk,(void *)allocator.m_memProps.memoryHeaps[0xf]._8_8_,1,
                                   (size_t)&imageReadySemaphore,VVar22);
      ::vk::checkResult((VkResult)pvVar18,"vkd.resetFences(device, 1, &imageReadyFence)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x5fa);
      uVar21 = allocator.m_memProps.memoryHeaps[0xf]._8_8_;
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
                ((RefBase<vk::Handle<(vk::HandleType)26>_> *)
                 &swapchainImages.
                  super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::numeric_limits<unsigned_long>::max();
      local_ed8 = (*devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator
                    [0x14].pfnFree)(vk,(void *)uVar21);
      if (local_ed8 == VK_SUBOPTIMAL_KHR) {
        this_04 = Context::getTestContext(context);
        this_05 = tcu::TestContext::getLog(this_04);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&renderingCompleteSemaphore,this_05,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar19 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&renderingCompleteSemaphore,(char (*) [5])0x13741ef);
        pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,&local_ed8);
        pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,(char (*) [11])" at frame ");
        pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,(uint *)&imageReadyFence);
        tcu::MessageBuilder::operator<<(pMVar19,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&renderingCompleteSemaphore);
      }
      else {
        ::vk::checkResult(local_ed8,"acquireResult",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                          ,0x607);
      }
      do {
        dVar5 = ::deGetFalse();
        if ((dVar5 != 0) ||
           (uVar13 = (ulong)(uint)local_ed4,
           sVar10 = std::
                    vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                    ::size((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                            *)local_cd8), sVar10 <= uVar13)) {
          this_06 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_06,(char *)0x0,"(size_t)imageNdx < swapchainImages.size()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                     ,0x60a);
          __cxa_throw(this_06,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      uVar13 = (ulong)(uint)imageReadyFence.m_internal;
      this_01 = &commandBuffers.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar10 = std::
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
               ::size((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                       *)this_01);
      pvVar15 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                              *)this_01,uVar13 % sVar10);
      pRVar16 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::operator*
                           (pvVar15)->super_RefBase<vk::Handle<(vk::HandleType)4>_>;
      pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::operator*(pRVar16);
      commandBuffer = (VkCommandBuffer)pHVar17->m_internal;
      uVar13 = (ulong)(uint)imageReadyFence.m_internal;
      sVar10 = std::
               vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
               ::size((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                       *)local_eb0);
      this_07 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                              *)local_eb0,uVar13 % sVar10);
      this_08 = &de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>::operator*(this_07)
                 ->super_RefBase<vk::VkCommandBuffer_s_*>;
      ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*(this_08);
      pVStack_1080 = *ppVVar20;
      submitInfo.pSignalSemaphores._4_4_ = 0x400;
      presentInfo.pResults._0_4_ = 4;
      submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      submitInfo._4_4_ = 0;
      submitInfo.pNext._0_4_ = 1;
      submitInfo._16_8_ = &acquireResult;
      submitInfo.pWaitSemaphores = (VkSemaphore *)((long)&submitInfo.pSignalSemaphores + 4);
      submitInfo.pWaitDstStageMask._0_4_ = 1;
      submitInfo._40_8_ = &stack0xffffffffffffef80;
      submitInfo.pCommandBuffers._0_4_ = 1;
      presentInfo._16_8_ = &commandBuffer;
      local_1110[0] = 0x3b9acde9;
      presentInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      presentInfo._4_4_ = 0;
      presentInfo.pNext._0_4_ = 1;
      presentInfo.pWaitSemaphores._0_4_ = 1;
      submitInfo._56_8_ = presentInfo._16_8_;
      presentInfo._32_8_ =
           ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)26>_> *)
                      &swapchainImages.
                       super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      presentInfo.pSwapchains = (VkSwapchainKHR *)local_ed4;
      presentInfo.pImageIndices = (deUint32 *)0x0;
      TriangleRenderer::recordFrame
                ((TriangleRenderer *)local_dc8,pVStack_1080,(deUint32)local_ed4,
                 (uint)imageReadyFence.m_internal);
      p_Var3 = devHelper.vkd.m_vk.getPastPresentationTimingGOOGLE;
      ::vk::Handle<(vk::HandleType)6>::Handle(&local_1118,0);
      HVar23.m_internal = local_1118.m_internal;
      pvVar18 = (*(devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator)->
                  pfnReallocation)(vk,p_Var3,1,(size_t)&presentInfo.pResults,
                                   (VkSystemAllocationScope)local_1118.m_internal);
      VVar22 = 0x629;
      ::vk::checkResult((VkResult)pvVar18,
                        "vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x629);
      VVar4 = (*devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator[0x14].
                pfnInternalAllocation)
                        (vk,(size_t)devHelper.vkd.m_vk.getPastPresentationTimingGOOGLE,
                         (VkInternalAllocationType)local_1110,VVar22);
      commandPool_00.m_internal = 0x62a;
      ::vk::checkResult(VVar4,"vkd.queuePresentKHR(devHelper.queue, &presentInfo)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x62a);
      uVar21 = extraout_RDX_00;
    }
    VVar4 = (*(devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator)->
              pfnInternalAllocation)
                      (vk,allocator.m_memProps.memoryHeaps[0xf]._8_8_,
                       (VkInternalAllocationType)uVar21,
                       (VkSystemAllocationScope)commandPool_00.m_internal);
    ::vk::checkResult(VVar4,"vkd.deviceWaitIdle(device)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x62e);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)26>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)26>_> *)local_c28,
               (Move<vk::Handle<(vk::HandleType)26>_> *)
               &swapchainImages.
                super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
               *)local_eb0);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
               *)&commandBuffers.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
               *)&renderingCompleteSemaphores.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
               *)&imageReadySemaphores.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_e08);
    TriangleRenderer::~TriangleRenderer((TriangleRenderer *)local_dc8);
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    ~vector((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
             *)local_cd8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)26>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)26>_> *)
               &swapchainImages.
                super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    swapchainInfo.oldSwapchain.m_internal._4_4_ = swapchainInfo.oldSwapchain.m_internal._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestStatus resizeSwapchainTest (Context& context, Type wsiType)
{
	const tcu::UVec2				desiredSize			(256, 256);
	const InstanceHelper			instHelper			(context, wsiType);
	const NativeObjects				native				(context, instHelper.supportedExtensions, wsiType, tcu::just(desiredSize));
	const Unique<VkSurfaceKHR>		surface				(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper				devHelper			(context, instHelper.vki, *instHelper.instance, *surface);
	const PlatformProperties&		platformProperties	= getPlatformProperties(wsiType);
	const VkSurfaceCapabilitiesKHR	capabilities		= getPhysicalDeviceSurfaceCapabilities(instHelper.vki, devHelper.physicalDevice, *surface);
	const DeviceInterface&			vkd					= devHelper.vkd;
	const VkDevice					device				= *devHelper.device;
	SimpleAllocator					allocator			(vkd, device, getPhysicalDeviceMemoryProperties(instHelper.vki, devHelper.physicalDevice));
	vector<tcu::UVec2>				sizes				= getSwapchainSizeSequence(capabilities, desiredSize);
	Move<VkSwapchainKHR>			prevSwapchain;

	DE_ASSERT(platformProperties.swapchainExtent != PlatformProperties::SWAPCHAIN_EXTENT_MUST_MATCH_WINDOW_SIZE);
	DE_UNREF(platformProperties);

	for (deUint32 sizeNdx = 0; sizeNdx < sizes.size(); ++sizeNdx)
	{
		// \todo [2016-05-30 jesse] This test currently waits for idle and
		// recreates way more than necessary when recreating the swapchain. Make
		// it match expected real app behavior better by smoothly switching from
		// old to new swapchain. Once that is done, it will also be possible to
		// test creating a new swapchain while images from the previous one are
		// still acquired.

		VkSwapchainCreateInfoKHR		swapchainInfo				= getBasicSwapchainParameters(wsiType, instHelper.vki, devHelper.physicalDevice, *surface, sizes[sizeNdx], 2);
		swapchainInfo.oldSwapchain = *prevSwapchain;

		Move<VkSwapchainKHR>			swapchain					(createSwapchainKHR(vkd, device, &swapchainInfo));
		const vector<VkImage>			swapchainImages				= getSwapchainImages(vkd, device, *swapchain);
		const TriangleRenderer			renderer					(vkd,
																	device,
																	allocator,
																	context.getBinaryCollection(),
																	swapchainImages,
																	swapchainInfo.imageFormat,
																	tcu::UVec2(swapchainInfo.imageExtent.width, swapchainInfo.imageExtent.height));
		const Unique<VkCommandPool>		commandPool					(createCommandPool(vkd, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, devHelper.queueFamilyIndex));
		const size_t					maxQueuedFrames				= swapchainImages.size()*2;

		// We need to keep hold of fences from vkAcquireNextImageKHR to actually
		// limit number of frames we allow to be queued.
		const vector<FenceSp>			imageReadyFences			(createFences(vkd, device, maxQueuedFrames));

		// We need maxQueuedFrames+1 for imageReadySemaphores pool as we need to pass
		// the semaphore in same time as the fence we use to meter rendering.
		const vector<SemaphoreSp>		imageReadySemaphores		(createSemaphores(vkd, device, maxQueuedFrames+1));

		// For rest we simply need maxQueuedFrames as we will wait for image
		// from frameNdx-maxQueuedFrames to become available to us, guaranteeing that
		// previous uses must have completed.
		const vector<SemaphoreSp>		renderingCompleteSemaphores	(createSemaphores(vkd, device, maxQueuedFrames));
		const vector<CommandBufferSp>	commandBuffers				(allocateCommandBuffers(vkd, device, *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY, maxQueuedFrames));

		try
		{
			const deUint32	numFramesToRender	= 60;

			for (deUint32 frameNdx = 0; frameNdx < numFramesToRender; ++frameNdx)
			{
				const VkFence		imageReadyFence		= **imageReadyFences[frameNdx%imageReadyFences.size()];
				const VkSemaphore	imageReadySemaphore	= **imageReadySemaphores[frameNdx%imageReadySemaphores.size()];
				deUint32			imageNdx			= ~0u;

				if (frameNdx >= maxQueuedFrames)
					VK_CHECK(vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max()));

				VK_CHECK(vkd.resetFences(device, 1, &imageReadyFence));

				{
					const VkResult	acquireResult	= vkd.acquireNextImageKHR(device,
																			  *swapchain,
																			  std::numeric_limits<deUint64>::max(),
																			  imageReadySemaphore,
																			  imageReadyFence,
																			  &imageNdx);

					if (acquireResult == VK_SUBOPTIMAL_KHR)
						context.getTestContext().getLog() << TestLog::Message << "Got " << acquireResult << " at frame " << frameNdx << TestLog::EndMessage;
					else
						VK_CHECK(acquireResult);
				}

				TCU_CHECK((size_t)imageNdx < swapchainImages.size());

				{
					const VkSemaphore			renderingCompleteSemaphore	= **renderingCompleteSemaphores[frameNdx%renderingCompleteSemaphores.size()];
					const VkCommandBuffer		commandBuffer				= **commandBuffers[frameNdx%commandBuffers.size()];
					const VkPipelineStageFlags	waitDstStage				= VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
					const VkSubmitInfo			submitInfo					=
					{
						VK_STRUCTURE_TYPE_SUBMIT_INFO,
						DE_NULL,
						1u,
						&imageReadySemaphore,
						&waitDstStage,
						1u,
						&commandBuffer,
						1u,
						&renderingCompleteSemaphore
					};
					const VkPresentInfoKHR		presentInfo					=
					{
						VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
						DE_NULL,
						1u,
						&renderingCompleteSemaphore,
						1u,
						&*swapchain,
						&imageNdx,
						(VkResult*)DE_NULL
					};

					renderer.recordFrame(commandBuffer, imageNdx, frameNdx);
					VK_CHECK(vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0));
					VK_CHECK(vkd.queuePresentKHR(devHelper.queue, &presentInfo));
				}
			}

			VK_CHECK(vkd.deviceWaitIdle(device));

			prevSwapchain = swapchain;
		}
		catch (...)
		{
			// Make sure device is idle before destroying resources
			vkd.deviceWaitIdle(device);
			throw;
		}
	}

	return tcu::TestStatus::pass("Resizing tests succeeded");
}